

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O0

void __thiscall dynamicgraph::SignalBase<int>::plug(SignalBase<int> *this,SignalBase<int> *sigarg)

{
  ExceptionSignal *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  allocator<char> local_41;
  string local_40 [36];
  ErrorCodeEnum local_1c;
  SignalBase<int> *local_18;
  SignalBase<int> *sigarg_local;
  SignalBase<int> *this_local;
  
  local_18 = sigarg;
  sigarg_local = this;
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_1c = PLUG_IMPOSSIBLE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Plug-in operation not possible with this signal. ",&local_41);
  getName_abi_cxx11_(local_18);
  uVar1 = std::__cxx11::string::c_str();
  getName_abi_cxx11_(this);
  uVar2 = std::__cxx11::string::c_str();
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_1c,local_40,"(while trying to plug %s on %s).",uVar1,uVar2);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
}

Assistant:

virtual void plug(SignalBase<Time> *sigarg) {
    DG_THROW ExceptionSignal(
        ExceptionSignal::PLUG_IMPOSSIBLE,
        "Plug-in operation not possible with this signal. ",
        "(while trying to plug %s on %s).", sigarg->getName().c_str(),
        this->getName().c_str());
  }